

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTsim.c
# Opt level: O1

int Gia_ManFindEqualFlop(Vec_Ptr_t *vFlops,int iFlop,int nFlopWords)

{
  uint uVar1;
  void **ppvVar2;
  void *__s2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  
  if ((-1 < iFlop) && (uVar1 = vFlops->nSize, iFlop < (int)uVar1)) {
    if (iFlop != 0) {
      ppvVar2 = vFlops->pArray;
      __s2 = ppvVar2[(uint)iFlop];
      uVar4 = 0;
      uVar5 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar5 = uVar4;
      }
      do {
        if (uVar5 == uVar4) goto LAB_0023d257;
        iVar3 = bcmp(ppvVar2[uVar4],__s2,(long)nFlopWords << 2);
        if (iVar3 == 0) {
          return (int)uVar4;
        }
        uVar4 = uVar4 + 1;
      } while ((uint)iFlop != uVar4);
    }
    return -1;
  }
LAB_0023d257:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

int Gia_ManFindEqualFlop( Vec_Ptr_t * vFlops, int iFlop, int nFlopWords )
{
    unsigned * pFlop, * pTemp;
    int i;
    pFlop = (unsigned *)Vec_PtrEntry( vFlops, iFlop );
    Vec_PtrForEachEntryStop( unsigned *, vFlops, pTemp, i, iFlop )
        if ( !memcmp( pTemp, pFlop, sizeof(unsigned) * nFlopWords ) )
            return i;
    return -1;
}